

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

char * deqp::gles31::Functional::anon_unknown_0::getFunctionDefinitionSRGBToLinearCheck(void)

{
  return getFunctionDefinitionSRGBToLinearCheck::functionDefinition;
}

Assistant:

const char* getFunctionDefinitionSRGBToLinearCheck (void)
{
	static const char* functionDefinition =
			"mediump vec4 srgbToLinearCheck(in mediump vec4 texelSRGBA, in mediump vec4 texelLinear) \n"
			"{ \n"
			"	const int NUM_CHANNELS = 4;"
			"	mediump vec4 texelSRGBAConverted; \n"
			"	mediump vec4 epsilonErr = vec4(0.005); \n"
			"	mediump vec4 testResult; \n"
			"	for (int idx = 0; idx < NUM_CHANNELS; idx++) \n"
			"	{ \n"
			"		texelSRGBAConverted[idx] = pow( (texelSRGBA[idx] + 0.055) / 1.055, 1.0 / 0.4116); \n"
			"	} \n"
			"	if ( all(lessThan(abs(texelSRGBAConverted - texelLinear), epsilonErr)) || all(equal(texelSRGBAConverted, texelLinear)) ) \n"
			"	{ \n"
			"		return testResult = vec4(0.0, 1.0, 0.0, 1.0); \n"
			"	} \n"
			"	else \n"
			"	{ \n"
			"		return testResult = vec4(1.0, 0.0, 0.0, 1.0); \n"
			"	} \n"
			"} \n";

	return functionDefinition;
}